

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<int,_int,_2U>::const_iterator::setToFind(const_iterator *this,int left,int right)

{
  IntervalMap<int,_int,_2U> *pIVar1;
  pointer pEVar2;
  ulong uVar3;
  uint uVar4;
  LeafNode<int,_int,_3U,_true> *self;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint32_t offset;
  ulong uVar8;
  int iVar9;
  uint uStack_3c;
  NodeRef NStack_38;
  
  pIVar1 = this->map;
  if (pIVar1->height != 0) {
    uVar4 = this->map->rootSize;
    uVar8 = 0;
    if ((ulong)uVar4 != 0) {
      uVar8 = 0;
      do {
        if (left <= *(int *)((long)&this->map->field_0 + uVar8 * 8 + 0x10)) goto LAB_0050d2f5;
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
      uVar8 = (ulong)uVar4;
    }
LAB_0050d2f5:
    offset = (int)uVar8 - 1;
    if ((int)uVar8 == 0) {
      offset = 0;
    }
    setRoot(this,offset);
    if (((this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len != 0)
       && (pEVar2 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                    data_, pEVar2->offset < pEVar2->size)) {
      iVar7 = (int)(this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                   len;
      uVar4 = iVar7 - 1;
      pEVar2 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
      ;
      NStack_38.pip.value =
           *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)
            ((long)pEVar2[uVar4].node + (ulong)pEVar2[uVar4].offset * 8);
      iVar7 = this->map->height - iVar7;
      if (iVar7 != 0) {
        do {
          uVar8 = (ulong)NStack_38.pip.value & 0xffffffffffffffc0;
          uVar4 = SUB84(NStack_38.pip.value,0) & 0x3f;
          iVar9 = uVar4 + 1;
          lVar6 = 0;
          do {
            if (left <= *(int *)(uVar8 + 0x60 + lVar6 * 8)) {
              iVar9 = (int)lVar6;
              break;
            }
            lVar6 = lVar6 + 1;
          } while ((ulong)uVar4 + 1 != lVar6);
          uStack_3c = iVar9 - 1;
          if (iVar9 == 0) {
            uStack_3c = 0;
          }
          uVar3 = (ulong)uStack_3c;
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
          emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                    ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,
                     &NStack_38,&uStack_3c);
          NStack_38.pip.value = *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)(uVar8 + uVar3 * 8)
          ;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      uVar4 = SUB84(NStack_38.pip.value,0) & 0x3f;
      uStack_3c = uVar4 + 1;
      lVar6 = 0;
      do {
        if (left <= *(int *)(((ulong)NStack_38.pip.value & 0xffffffffffffffc0) + lVar6 * 8)) {
          uStack_3c = (uint)lVar6;
          break;
        }
        lVar6 = lVar6 + 1;
      } while ((ulong)uVar4 + 1 != lVar6);
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
      emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,&NStack_38,
                 &uStack_3c);
    }
    return;
  }
  uVar5 = (ulong)pIVar1->rootSize;
  uVar3 = 0;
  uVar8 = uVar3;
  if (uVar5 != 0) {
    do {
      uVar8 = uVar3;
      if (left <= *(int *)((long)&pIVar1->field_0 + uVar3 * 8)) break;
      uVar3 = uVar3 + 1;
      uVar8 = uVar5;
    } while (uVar5 != uVar3);
  }
  setRoot(this,(uint32_t)uVar8);
  return;
}

Assistant:

bool isFlat() const {
        SLANG_ASSERT(map);
        return map->isFlat();
    }